

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O3

void mxx::
     redo_arbit_decomposition<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out,
               size_t new_local_size,comm *comm)

{
  int iVar1;
  int iVar2;
  int *msgs;
  unsigned_long uVar3;
  long *plVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> new_local_sizes;
  allocator_type local_b9;
  size_t local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  int *local_98;
  size_t local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  custom_op<unsigned_long,_true> local_70;
  
  local_b8 = (long)end._M_current - (long)begin._M_current >> 2;
  local_90 = new_local_size;
  if (comm->m_size == 1) {
    if (local_b8 != new_local_size) {
      MPI_Comm_rank(&ompi_mpi_comm_world,&local_70);
      printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
             (ulong)(uint)local_70._vptr_custom_op,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
             ,0x19a,"redo_arbit_decomposition","local_size == new_local_size");
      fflush(_stdout);
      MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
    }
    if (end._M_current != begin._M_current) {
      memmove(out._M_current,begin._M_current,(long)end._M_current - (long)begin._M_current);
    }
  }
  else {
    local_98 = begin._M_current;
    custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
              ((custom_op<unsigned_long,true> *)&local_70);
    MPI_Allreduce(&local_b8,&local_b0,1,local_70.m_type_copy,local_70.m_op);
    uVar9 = CONCAT44(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     (uint)local_b0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start);
    custom_op<unsigned_long,_true>::~custom_op(&local_70);
    uVar3 = exscan<unsigned_long,std::plus<unsigned_long>>(&local_b8,comm);
    uVar6 = 0;
    if (comm->m_rank == 0) {
      uVar3 = uVar6;
    }
    allgather<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,&local_90,1,comm);
    msgs = local_98;
    plVar4 = (long *)CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op);
    if (plVar4 != (long *)local_70.m_user_func.super__Function_base._M_functor._M_unused._0_8_) {
      uVar6 = 0;
      do {
        uVar6 = uVar6 + *plVar4;
        plVar4 = plVar4 + 1;
      } while (plVar4 != (long *)local_70.m_user_func.super__Function_base._M_functor._M_unused.
                                 _0_8_);
    }
    if (uVar6 != uVar9) {
      MPI_Comm_rank(&ompi_mpi_comm_world,&local_b0);
      printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
             (ulong)(uint)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
             ,0x1b8,"redo_arbit_decomposition");
      fflush(_stdout);
      MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
    }
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_b0,(long)comm->m_size,(value_type_conflict2 *)&local_88,&local_b9);
    iVar1 = comm->m_size;
    if (iVar1 < 2) {
      uVar5 = 0;
      uVar9 = 0;
    }
    else {
      uVar5 = iVar1 - 1;
      uVar8 = 0;
      uVar6 = 0;
      do {
        uVar9 = *(long *)(CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op) +
                         uVar8 * 8) + uVar6;
        if (uVar3 < uVar9) {
          uVar5 = (uint)uVar8;
          uVar9 = uVar6;
          break;
        }
        uVar8 = uVar8 + 1;
        uVar6 = uVar9;
      } while (uVar5 != uVar8);
    }
    if ((int)uVar5 < iVar1 && local_b8 != 0) {
      lVar10 = 0;
      sVar7 = local_b8;
      do {
        uVar9 = uVar9 + *(long *)(CONCAT44(local_70._vptr_custom_op._4_4_,
                                           (uint)local_70._vptr_custom_op) + (ulong)uVar5 * 8 +
                                 lVar10 * 8);
        uVar6 = uVar9 - uVar3;
        if (sVar7 < uVar9 - uVar3) {
          uVar6 = sVar7;
        }
        *(ulong *)((ulong)uVar5 * 8 +
                   CONCAT44(local_b0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            (uint)local_b0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start) + lVar10 * 8) = uVar6;
        sVar7 = sVar7 - uVar6;
        if (sVar7 == 0) break;
        uVar3 = uVar3 + uVar6;
        iVar2 = (int)lVar10;
        lVar10 = lVar10 + 1;
      } while ((int)(uVar5 + 1 + iVar2) < iVar1);
    }
    all2all<unsigned_long>(&local_88,&local_b0,comm);
    all2allv<int>(msgs,&local_b0,out._M_current,&local_88,comm);
    if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((void *)CONCAT44(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         (uint)local_b0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_b0.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (uint)local_b0.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start));
    }
    if ((void *)CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op) !=
        (void *)0x0) {
      operator_delete((void *)CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op
                                      ));
    }
  }
  return;
}

Assistant:

void redo_arbit_decomposition(_InIterator begin, _InIterator end, _OutIterator out, std::size_t new_local_size, const mxx::comm& comm) {
    // get local size
    std::size_t local_size = std::distance(begin, end);

    // if single process, simply copy to output
    if (comm.size() == 1) {
        MXX_ASSERT(local_size == new_local_size);
        std::copy(begin, end, out);
        return;
    }

    // get prefix sum of size and total size
#if !defined(NDEBUG) || MEASURE_LOAD_BALANCE != 0
    size_t total_size = mxx::allreduce(local_size, comm);
#endif
    size_t prefix = mxx::exscan(local_size, comm);
    if (comm.rank() == 0)
        prefix = 0;

#if MEASURE_LOAD_BALANCE
    size_t min = mxx::reduce(local_size, 0, mxx::min<size_t>(), comm);
    size_t max = mxx::reduce(local_size, 0, mxx::max<size_t>(), comm);
    size_t min_new = mxx::reduce(new_local_size, 0, mxx::min<size_t>(), comm);
    size_t max_new = mxx::reduce(new_local_size, 0, mxx::max<size_t>(), comm);
    if(comm.rank() == 0)
      std::cerr << " Decomposition: old [" << min << "," << max << "], new= [" << min_new << "," << max_new << "], for n=" << total_size << " fair decomposition: " << total_size / comm.size() << std::endl;

    std::vector<std::size_t> toReceive = mxx::gather(new_local_size, 0, comm);
    if(comm.rank() == 0)
      std::cerr << toReceive << std::endl;
#endif

    // get the new local sizes from all processors
    // NOTE: this all-gather is what makes the arbitrary decomposition worse
    // in terms of complexity than when assuming a block decomposition
    std::vector<std::size_t> new_local_sizes = mxx::allgather(new_local_size, comm);
    MXX_ASSERT(std::accumulate(new_local_sizes.begin(), new_local_sizes.end(), 0ull) == total_size);

    // calculate where to send elements
    std::vector<size_t> send_counts(comm.size(), 0);
    int first_p;
    std::size_t new_prefix = 0;
    for (first_p = 0; first_p < comm.size()-1; ++first_p)
    {
        // find processor for which the prefix sum exceeds mine
        // i have to send to the previous
        if (new_prefix + new_local_sizes[first_p] > prefix)
            break;
        new_prefix += new_local_sizes[first_p];
    }

    //= block_partition_target_processor(total_size, p, prefix);
    std::size_t left_to_send = local_size;
    for (; left_to_send > 0 && first_p < comm.size(); ++first_p)
    {
        // make the `new` prefix inclusive (is an exlcusive prefix prior)
        new_prefix += new_local_sizes[first_p];
        // send as many elements to the current processor as it needs to fill
        // up, but at most as many as I have left
        std::size_t nsend = std::min<std::size_t>(new_prefix - prefix, left_to_send);
        send_counts[first_p] = nsend;
        // update the number of elements i have left (`left_to_send`) and
        // at which global index they start `prefix`
        left_to_send -= nsend;
        prefix += nsend;
    }

    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    // TODO: all2allv for iterators
    mxx::all2allv(&(*begin), send_counts, &(*out), recv_counts, comm);
}